

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O2

matrix_type * __thiscall
Disa::Matrix_Dense<double,0ul,0ul>::operator+=
          (Matrix_Dense<double,0ul,0ul> *this,Matrix_Dense<double,_2UL,_3UL> *matrix)

{
  ostream *poVar1;
  size_t __val;
  source_location *in_RCX;
  size_t row;
  ulong uVar2;
  long lVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pVar4 = Matrix_Dense<double,_0UL,_0UL>::size((Matrix_Dense<double,_0UL,_0UL> *)this);
  if ((pVar4.first == 2) && (pVar4.second == 3)) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < (ulong)((*(long *)(this + 8) - *(long *)this) / 0x18); uVar2 = uVar2 + 1
        ) {
      Vector_Dense<double,0ul>::operator+=
                ((Vector_Dense<double,0ul> *)(*(long *)this + lVar3),
                 (Vector_Dense<double,_3UL> *)
                 ((long)(matrix->super_array<Disa::Vector_Dense<double,_3UL>,_2UL>)._M_elems[0].
                        super_array<double,_3UL>._M_elems + lVar3));
      lVar3 = lVar3 + 0x18;
    }
    return (matrix_type *)this;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_50 = &PTR_s__workspace_llm4binary_github_lic_00172310;
  console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_50,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  std::__cxx11::to_string(&local_170,(*(long *)(this + 8) - *(long *)this) / 0x18);
  std::operator+(&local_150,"Incompatible matrix dimensions, ",&local_170);
  std::operator+(&local_130,&local_150,",");
  __val = Matrix_Dense<double,_0UL,_0UL>::size_column((Matrix_Dense<double,_0UL,_0UL> *)this);
  std::__cxx11::to_string(&local_190,__val);
  std::operator+(&local_110,&local_130,&local_190);
  std::operator+(&local_f0,&local_110," vs. ");
  std::__cxx11::to_string(&local_1b0,2);
  std::operator+(&local_d0,&local_f0,&local_1b0);
  std::operator+(&local_b0,&local_d0,",");
  std::__cxx11::to_string(&local_1d0,3);
  std::operator+(&local_90,&local_b0,&local_1d0);
  std::operator+(&local_70,&local_90,".");
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_48);
  exit(1);
}

Assistant:

constexpr matrix_type& operator+=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    FOR(row, size_row())(*this)[row] += matrix[row];
    return *this;
  }